

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_container_select
                (bitset_container_t *container,uint32_t *start_rank,uint32_t rank,uint32_t *element)

{
  uint64_t *puVar1;
  int iVar2;
  int *in_RCX;
  uint in_EDX;
  uint *in_RSI;
  bitset_container_t *in_RDI;
  int r;
  uint64_t t;
  uint16_t base;
  uint64_t w;
  int i;
  int32_t size;
  uint64_t *words;
  int card;
  ulong local_48;
  uint local_40;
  byte local_1;
  
  iVar2 = bitset_container_cardinality(in_RDI);
  if (in_EDX < *in_RSI + iVar2) {
    puVar1 = in_RDI->words;
    for (local_40 = 0; (int)local_40 < 0x400; local_40 = local_40 + 1) {
      iVar2 = roaring_hamming(puVar1[(int)local_40]);
      if (*in_RSI + iVar2 < in_EDX) {
        *in_RSI = iVar2 + *in_RSI;
      }
      else {
        local_48 = in_RDI->words[(int)local_40];
        while (local_48 != 0) {
          iVar2 = roaring_trailing_zeroes(local_48);
          if (*in_RSI == in_EDX) {
            *in_RCX = iVar2 + (local_40 & 0x3ff) * 0x40;
            local_1 = 1;
            goto LAB_00130a78;
          }
          local_48 = local_48 & (local_48 ^ 0xffffffffffffffff) + 1 ^ local_48;
          *in_RSI = *in_RSI + 1;
        }
      }
    }
  }
  else {
    *in_RSI = iVar2 + *in_RSI;
    local_1 = 0;
  }
LAB_00130a78:
  return (_Bool)(local_1 & 1);
}

Assistant:

bool bitset_container_select(const bitset_container_t *container, uint32_t *start_rank, uint32_t rank, uint32_t *element) {
    int card = bitset_container_cardinality(container);
    if(rank >= *start_rank + card) {
        *start_rank += card;
        return false;
    }
    const uint64_t *words = container->words;
    int32_t size;
    for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; i += 1) {
        size = roaring_hamming(words[i]);
        if(rank <= *start_rank + size) {
            uint64_t w = container->words[i];
            uint16_t base = i*64;
            while (w != 0) {
                uint64_t t = w & (~w + 1);
                int r = roaring_trailing_zeroes(w);
                if(*start_rank == rank) {
                    *element = r+base;
                    return true;
                }
                w ^= t;
                *start_rank += 1;
            }
        }
        else
            *start_rank += size;
    }
    assert(false);
    roaring_unreachable;
}